

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLNode_search_attribute(XMLNode *node,SXML_CHAR *attr_name,int i_search)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = -1;
  iVar4 = iVar2;
  if ((((attr_name != (SXML_CHAR *)0x0 && node != (XMLNode *)0x0) && (-1 < i_search)) &&
      (*attr_name != '\0')) && (iVar1 = node->n_attributes, i_search < iVar1)) {
    lVar5 = (ulong)(uint)i_search * 0x18 + 0x10;
    while ((iVar4 = iVar2, i_search < iVar1 &&
           ((*(int *)((long)&node->attributes->name + lVar5) == 0 ||
            (iVar3 = strcmp(*(char **)((long)node->attributes + lVar5 + -0x10),attr_name),
            iVar4 = i_search, iVar3 != 0))))) {
      lVar5 = lVar5 + 0x18;
      i_search = i_search + 1;
    }
  }
  return iVar4;
}

Assistant:

int XMLNode_search_attribute(const XMLNode* node, const SXML_CHAR* attr_name, int i_search)
{
	int i;
	
	if (node == NULL || attr_name == NULL || attr_name[0] == NULC || i_search < 0 || i_search >= node->n_attributes)
		return -1;
	
	for (i = i_search; i < node->n_attributes; i++)
		if (node->attributes[i].active && !sx_strcmp(node->attributes[i].name, attr_name))
			return i;
	
	return -1;
}